

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableLazyMessageFieldLiteGenerator::GenerateMembers
          (RepeatedImmutableLazyMessageFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &(this->super_RepeatedImmutableMessageFieldLiteGenerator).variables_;
  io::Printer::Print(printer,variables,
                     "private com.google.protobuf.Internal.ProtobufList<\n    com.google.protobuf.LazyFieldLite> $name$_;\n"
                    );
  PrintExtraFieldInfo(variables,printer);
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,variables,
                     "$deprecation$public java.util.List<$type$>\n    get$capitalized_name$List() {\n  java.util.List<$type$> list =\n      new java.util.ArrayList<$type$>($name$_.size());\n  for (com.google.protobuf.LazyFieldLite lf : $name$_) {\n    list.add(($type$) lf.getValue($type$.getDefaultInstance()));\n  }\n  return java.util.Collections.unmodifiableList(list);\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,variables,
                     "$deprecation$public java.util.List<? extends $type$OrBuilder>\n    get$capitalized_name$OrBuilderList() {\n  return get$capitalized_name$List();\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,variables,
                     "$deprecation$public int get$capitalized_name$Count() {\n  return $name$_.size();\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$ get$capitalized_name$(int index) {\n  return ($type$)\n      $name$_.get(index).getValue($type$.getDefaultInstance());\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$OrBuilder get$capitalized_name$OrBuilder(\n    int index) {\n  return ($type$OrBuilder)\n      $name$_.get(index).getValue($type$.getDefaultInstance());\n}\n"
                    );
  io::Printer::Print(printer,variables,
                     "private void ensure$capitalized_name$IsMutable() {\n  if (!$is_mutable$) {\n    $name$_ =\n        com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n   }\n}\n\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,variables,
                     "private void set$capitalized_name$(\n    int index, $type$ value) {\n  if (value == null) {\n    throw new NullPointerException();\n  }\n  ensure$capitalized_name$IsMutable();\n  $name$_.set(\n      index, com.google.protobuf.LazyFieldLite.fromValue(value));\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,variables,
                     "private void set$capitalized_name$(\n    int index, $type$.Builder builderForValue) {\n  ensure$capitalized_name$IsMutable();\n  $name$_.set(index, com.google.protobuf.LazyFieldLite.fromValue(\n      builderForValue.build()));\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,variables,
                     "private void add$capitalized_name$($type$ value) {\n  if (value == null) {\n    throw new NullPointerException();\n  }\n  ensure$capitalized_name$IsMutable();\n  $name$_.add(com.google.protobuf.LazyFieldLite.fromValue(value));\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,variables,
                     "private void add$capitalized_name$(\n    int index, $type$ value) {\n  if (value == null) {\n    throw new NullPointerException();\n  }\n  ensure$capitalized_name$IsMutable();\n  $name$_.add(\n      index, com.google.protobuf.LazyFieldLite.fromValue(value));\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,variables,
                     "private void add$capitalized_name$(\n    $type$.Builder builderForValue) {\n  ensure$capitalized_name$IsMutable();\n  $name$_.add(com.google.protobuf.LazyFieldLite.fromValue(\n      builderForValue.build()));\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,variables,
                     "private void add$capitalized_name$(\n    int index, $type$.Builder builderForValue) {\n  ensure$capitalized_name$IsMutable();\n  $name$_.add(index, com.google.protobuf.LazyFieldLite.fromValue(\n      builderForValue.build()));\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,variables,
                     "private void addAll$capitalized_name$(\n    java.lang.Iterable<? extends $type$> values) {\n  ensure$capitalized_name$IsMutable();\n  for (com.google.protobuf.MessageLite v : values) {\n    $name$_.add(com.google.protobuf.LazyFieldLite.fromValue(v));\n  }\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,variables,
                     "private void clear$capitalized_name$() {\n  $name$_ = emptyProtobufList();\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_RepeatedImmutableMessageFieldLiteGenerator).descriptor_)
  ;
  io::Printer::Print(printer,variables,
                     "private void remove$capitalized_name$(int index) {\n  ensure$capitalized_name$IsMutable();\n  $name$_.remove(index);\n}\n"
                    );
  return;
}

Assistant:

void RepeatedImmutableLazyMessageFieldLiteGenerator::
GenerateMembers(io::Printer* printer) const {
  printer->Print(variables_,
    "private com.google.protobuf.Internal.ProtobufList<\n"
    "    com.google.protobuf.LazyFieldLite> $name$_;\n");
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.util.List<$type$>\n"
    "    get$capitalized_name$List() {\n"
    "  java.util.List<$type$> list =\n"
    "      new java.util.ArrayList<$type$>($name$_.size());\n"
    "  for (com.google.protobuf.LazyFieldLite lf : $name$_) {\n"
    "    list.add(($type$) lf.getValue($type$.getDefaultInstance()));\n"
    "  }\n"
    "  return java.util.Collections.unmodifiableList(list);\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.util.List<? extends $type$OrBuilder>\n"
    "    get$capitalized_name$OrBuilderList() {\n"
    "  return get$capitalized_name$List();\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public int get$capitalized_name$Count() {\n"
    "  return $name$_.size();\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$(int index) {\n"
    "  return ($type$)\n"
    "      $name$_.get(index).getValue($type$.getDefaultInstance());\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$OrBuilder get$capitalized_name$OrBuilder(\n"
    "    int index) {\n"
    "  return ($type$OrBuilder)\n"
    "      $name$_.get(index).getValue($type$.getDefaultInstance());\n"
    "}\n");

  printer->Print(variables_,
    "private void ensure$capitalized_name$IsMutable() {\n"
    "  if (!$is_mutable$) {\n"
    "    $name$_ =\n"
    "        com.google.protobuf.GeneratedMessageLite.mutableCopy($name$_);\n"
    "   }\n"
    "}\n"
    "\n");

  // Builder setRepeatedField(int index, Field value)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void set$capitalized_name$(\n"
    "    int index, $type$ value) {\n"
    "  if (value == null) {\n"
    "    throw new NullPointerException();\n"
    "  }\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.set(\n"
    "      index, com.google.protobuf.LazyFieldLite.fromValue(value));\n"
    "}\n");

  // Builder setRepeatedField(int index, Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void set$capitalized_name$(\n"
    "    int index, $type$.Builder builderForValue) {\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.set(index, com.google.protobuf.LazyFieldLite.fromValue(\n"
    "      builderForValue.build()));\n"
    "}\n");

  // Builder addRepeatedField(Field value)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void add$capitalized_name$($type$ value) {\n"
    "  if (value == null) {\n"
    "    throw new NullPointerException();\n"
    "  }\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.add(com.google.protobuf.LazyFieldLite.fromValue(value));\n"
    "}\n");

  // Builder addRepeatedField(int index, Field value)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void add$capitalized_name$(\n"
    "    int index, $type$ value) {\n"
    "  if (value == null) {\n"
    "    throw new NullPointerException();\n"
    "  }\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.add(\n"
    "      index, com.google.protobuf.LazyFieldLite.fromValue(value));\n"
    "}\n");

  // Builder addRepeatedField(Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void add$capitalized_name$(\n"
    "    $type$.Builder builderForValue) {\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.add(com.google.protobuf.LazyFieldLite.fromValue(\n"
    "      builderForValue.build()));\n"
    "}\n");

  // Builder addRepeatedField(int index, Field.Builder builderForValue)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void add$capitalized_name$(\n"
    "    int index, $type$.Builder builderForValue) {\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.add(index, com.google.protobuf.LazyFieldLite.fromValue(\n"
    "      builderForValue.build()));\n"
    "}\n");

  // Builder addAllRepeatedField(Iterable<Field> values)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void addAll$capitalized_name$(\n"
    "    java.lang.Iterable<? extends $type$> values) {\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  for (com.google.protobuf.MessageLite v : values) {\n"
    "    $name$_.add(com.google.protobuf.LazyFieldLite.fromValue(v));\n"
    "  }\n"
    "}\n");

  // Builder clearAllRepeatedField()
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void clear$capitalized_name$() {\n"
    "  $name$_ = emptyProtobufList();\n"
    "}\n");

  // Builder removeRepeatedField(int index)
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void remove$capitalized_name$(int index) {\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.remove(index);\n"
    "}\n");
}